

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorLink.c
# Opt level: O1

int ExorLinkCubeIteratorNext(Cube **pGroup)

{
  int iVar1;
  drow *pdVar2;
  drow *pdVar3;
  byte bVar4;
  Cube *pCVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  drow *pdVar10;
  long lVar11;
  int iVar12;
  int (*paiVar13) [3];
  uint uVar14;
  long lVar15;
  
  if (fWorking == '\0') {
    __assert_fail("fWorking",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                  ,0x237,"int ExorLinkCubeIteratorNext(Cube **)");
  }
  iVar7 = 0;
  if (nVisitedGroups != nGroups) {
    GroupCostBest = -1;
    if (0 < nGroups) {
      iVar7 = -1;
      lVar9 = 0;
      iVar12 = 0;
      do {
        if (((*(uint *)((long)s_BitMasks + lVar9) & VisitedGroups) == 0) &&
           (iVar1 = *(int *)((long)GroupCosts + lVar9), iVar7 < iVar1)) {
          iVar7 = iVar1;
          GroupCostBest = iVar1;
          GroupCostBestNum = iVar12;
        }
        iVar12 = iVar12 + 1;
        lVar9 = lVar9 + 4;
      } while ((ulong)(uint)nGroups << 2 != lVar9);
    }
    if (GroupCostBest == -1) {
      __assert_fail("GroupCostBest != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                    ,0x255,"int ExorLinkCubeIteratorNext(Cube **)");
    }
    LastGroup = 0;
    if (0 < nCubes) {
      lVar9 = 0;
      do {
        CubeNum = s_ELGroupRules[nDist][GroupCostBestNum][lVar9];
        LastGroup = LastGroup | s_BitMasks[CubeNum];
        if (ELCubes[CubeNum] == (Cube *)0x0) {
          pCVar5 = GetFreeCube();
          lVar8 = (long)CubeNum;
          ELCubes[lVar8] = pCVar5;
          if (0 < g_CoverInfo.nWordsIn) {
            pdVar2 = pCVar5->pCubeDataIn;
            pdVar10 = DammyBitData;
            lVar11 = 0;
            do {
              pdVar2[lVar11] = *pdVar10;
              lVar11 = lVar11 + 1;
              pdVar10 = pdVar10 + 1;
            } while (lVar11 < g_CoverInfo.nWordsIn);
          }
          NewZ = 0;
          if (DiffVars[0] < 0) {
            iVar7 = s_ELCubeRules[nDist][lVar8][nDiffVarsIn];
            if (iVar7 == 0) {
              if (0 < g_CoverInfo.nWordsOut) {
                NewZ = 0;
                pdVar2 = pCA->pCubeDataOut;
                pdVar10 = pCVar5->pCubeDataOut;
                lVar11 = 0;
                do {
                  uVar14 = pdVar2[lVar11];
                  pdVar10[lVar11] = uVar14;
                  NewZ = NewZ + (uint)BitCount[uVar14 >> 0x10] + (uint)BitCount[uVar14 & 0xffff];
                  lVar11 = lVar11 + 1;
                } while (lVar11 < g_CoverInfo.nWordsOut);
              }
            }
            else if (iVar7 == 1) {
              if (0 < g_CoverInfo.nWordsOut) {
                NewZ = 0;
                pdVar2 = pCB->pCubeDataOut;
                pdVar10 = pCVar5->pCubeDataOut;
                lVar11 = 0;
                do {
                  uVar14 = pdVar2[lVar11];
                  pdVar10[lVar11] = uVar14;
                  NewZ = NewZ + (uint)BitCount[uVar14 >> 0x10] + (uint)BitCount[uVar14 & 0xffff];
                  lVar11 = lVar11 + 1;
                } while (lVar11 < g_CoverInfo.nWordsOut);
              }
            }
            else if ((iVar7 == 2) && (0 < g_CoverInfo.nWordsOut)) {
              NewZ = 0;
              pdVar2 = pCA->pCubeDataOut;
              pdVar10 = pCB->pCubeDataOut;
              pdVar3 = pCVar5->pCubeDataOut;
              lVar11 = 0;
              do {
                uVar14 = pdVar10[lVar11] ^ pdVar2[lVar11];
                pdVar3[lVar11] = uVar14;
                NewZ = NewZ + (uint)BitCount[uVar14 >> 0x10] + (uint)BitCount[uVar14 & 0xffff];
                lVar11 = lVar11 + 1;
              } while (lVar11 < g_CoverInfo.nWordsOut);
            }
          }
          else {
            if (0 < g_CoverInfo.nWordsOut) {
              pdVar2 = pCA->pCubeDataOut;
              pdVar10 = pCVar5->pCubeDataOut;
              lVar11 = 0;
              do {
                pdVar10[lVar11] = pdVar2[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 < g_CoverInfo.nWordsOut);
            }
            NewZ = (int)pCA->z;
          }
          lVar11 = (long)nDiffVarsIn;
          if (0 < lVar11) {
            lVar6 = (long)nDist;
            pdVar2 = pCVar5->pCubeDataIn;
            paiVar13 = DiffVarValues;
            lVar15 = 0;
            do {
              pdVar2[*(int *)((long)DiffVarWords + lVar15)] =
                   pdVar2[*(int *)((long)DiffVarWords + lVar15)] |
                   (*paiVar13)[*(int *)((long)s_ELCubeRules[lVar6][lVar8] + lVar15)] <<
                   (*(byte *)((long)DiffVarBits + lVar15) & 0x1f);
              lVar15 = lVar15 + 4;
              paiVar13 = paiVar13 + 1;
            } while (lVar11 * 4 != lVar15);
          }
          pCVar5->a = (short)CubeLiterals[lVar8] + (short)StartingLiterals;
          pCVar5->z = (short)NewZ;
          iVar7 = ComputeQCostBits(pCVar5);
          pCVar5 = ELCubes[CubeNum];
          pCVar5->q = (short)iVar7;
          if (NewZ == 0xff) {
            __assert_fail("NewZ != 255",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                          ,0x295,"int ExorLinkCubeIteratorNext(Cube **)");
          }
          iVar7 = g_CoverInfo.cIDs + 1;
          bVar4 = (byte)g_CoverInfo.cIDs;
          g_CoverInfo.cIDs = iVar7;
          pCVar5->ID = bVar4;
          if (iVar7 == 0x100) {
            g_CoverInfo.cIDs = 1;
          }
        }
        pGroup[lVar9] = ELCubes[CubeNum];
        lVar9 = lVar9 + 1;
      } while (lVar9 < nCubes);
    }
    VisitedGroups = VisitedGroups | s_BitMasks[GroupCostBestNum];
    lVar9 = (long)nVisitedGroups;
    nVisitedGroups = nVisitedGroups + 1;
    GroupOrder[lVar9] = GroupCostBestNum;
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int ExorLinkCubeIteratorNext( Cube** pGroup )
// give the next group in the decreasing order of sum of literals
// returns 1 on success, returns 0 if there are no more groups
{
    int i, c;

    // check that everything is okey
    assert( fWorking );

    if ( nVisitedGroups == nGroups ) 
    // we have iterated through all groups
        return 0;

    // find the min/max cost group
    if ( fMinLitGroupsFirst[nDist] ) 
//  if ( nCubes == 4 ) 
    { // find the minimum cost
        // go through all groups
        GroupCostBest = LARGE_NUM;
        for ( i = 0; i < nGroups; i++ )
            if ( !(VisitedGroups & s_BitMasks[i]) && GroupCostBest > GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
        assert( GroupCostBest != LARGE_NUM );
    }
    else 
    { // find the maximum cost
        // go through all groups
        GroupCostBest = -1;
        for ( i = 0; i < nGroups; i++ )
            if ( !(VisitedGroups & s_BitMasks[i]) && GroupCostBest < GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
        assert( GroupCostBest != -1 );
    }

    // create the cubes needed for the group, if they are not created already
    LastGroup = 0;
    for ( c = 0; c < nCubes; c++ )
    {
        CubeNum = s_ELGroupRules[nDist][GroupCostBestNum][c];
        LastGroup |= s_BitMasks[CubeNum];

        if ( ELCubes[CubeNum] == NULL ) // this cube does not exist
        {
            // bring a cube from the free cube list
            ELCubes[CubeNum] = GetFreeCube();

            // copy the input bit data into the cube 
            for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
                ELCubes[CubeNum]->pCubeDataIn[i] = DammyBitData[i];

            // copy the output bit data into the cube
            NewZ = 0;
            if ( DiffVars[0] >= 0 ) // the output is not involved in ExorLink
            {
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    ELCubes[CubeNum]->pCubeDataOut[i] = pCA->pCubeDataOut[i];
                NewZ = pCA->z;
            }
            else // the output is involved
            { // determine where the output information comes from
                Value = s_ELCubeRules[nDist][CubeNum][nDiffVarsIn];
                if ( Value == vs0 )
                    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    {
                        Temp = pCA->pCubeDataOut[i];
                        ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                        NewZ += BIT_COUNT(Temp);
                    }
                else if ( Value == vs1 )
                    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    {
                        Temp = pCB->pCubeDataOut[i];
                        ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                        NewZ += BIT_COUNT(Temp);
                    }
                else if ( Value == vsX )
                    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    {
                        Temp = pCA->pCubeDataOut[i] ^ pCB->pCubeDataOut[i];
                        ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                        NewZ += BIT_COUNT(Temp);
                    }
            }

            // set the variables that should be there
            for ( i = 0; i < nDiffVarsIn; i++ )
            {
                Value = DiffVarValues[i][ s_ELCubeRules[nDist][CubeNum][i] ];
                ELCubes[CubeNum]->pCubeDataIn[ DiffVarWords[i] ] |= ( Value << DiffVarBits[i] );
            }

            // set the number of literals and output ones
            ELCubes[CubeNum]->a = StartingLiterals + CubeLiterals[CubeNum];
            ELCubes[CubeNum]->z = NewZ;
            ELCubes[CubeNum]->q = ComputeQCostBits( ELCubes[CubeNum] );
            assert( NewZ != 255 );

            // assign the ID
            ELCubes[CubeNum]->ID = g_CoverInfo.cIDs++;
            // skip through zero-ID
            if ( g_CoverInfo.cIDs == 256 )
                g_CoverInfo.cIDs = 1;

        }
        // prepare the return array
        pGroup[c] = ELCubes[CubeNum];
    }

    // mark this group as visited 
    VisitedGroups |= s_BitMasks[ GroupCostBestNum ];
    // set the next visited group number and
    // increment the counter of visited groups
    GroupOrder[ nVisitedGroups++ ] = GroupCostBestNum;
    return 1;
}